

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip.cpp
# Opt level: O1

bool __thiscall LASzip::unpack(LASzip *this,U8 *bytes,I32 num)

{
  uint uVar1;
  ushort uVar2;
  LASitem *pLVar3;
  ushort *puVar4;
  char *error;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  
  if (num < 0x22) {
    error = "too few bytes to unpack";
  }
  else {
    uVar1 = num - 0x22;
    if ((uVar1 * -0x55555555 >> 1 | (uint)((uVar1 * -0x55555555 & 1) != 0) << 0x1f) < 0x2aaaaaab) {
      if (5 < uVar1) {
        this->num_items = (unsigned_short)((ulong)uVar1 / 6);
        if (this->items != (LASitem *)0x0) {
          operator_delete__(this->items);
        }
        pLVar3 = (LASitem *)operator_new__((ulong)this->num_items << 3);
        this->items = pLVar3;
        this->compressor = *(unsigned_short *)bytes;
        this->coder = *(unsigned_short *)(bytes + 2);
        this->version_major = bytes[4];
        this->version_minor = bytes[5];
        this->version_revision = *(unsigned_short *)(bytes + 6);
        this->options = *(uint *)(bytes + 8);
        this->chunk_size = *(uint *)(bytes + 0xc);
        this->number_of_special_evlrs = *(SIGNED_INT64 *)(bytes + 0x10);
        this->offset_to_special_evlrs = *(SIGNED_INT64 *)(bytes + 0x18);
        uVar2 = *(ushort *)(bytes + 0x20);
        puVar4 = (ushort *)(bytes + 0x22);
        this->num_items = uVar2;
        if ((ulong)uVar2 != 0) {
          uVar5 = 0;
          do {
            pLVar3[uVar5].type = (uint)*puVar4;
            pLVar3[uVar5].size = puVar4[1];
            pLVar3[uVar5].version = puVar4[2];
            puVar4 = puVar4 + 3;
            uVar5 = uVar5 + 1;
          } while (uVar2 != uVar5);
        }
        if ((ushort *)(bytes + (uint)num) == puVar4) {
          bVar7 = this->num_items == 0;
          if (bVar7) {
            return bVar7;
          }
          lVar6 = 0;
          uVar5 = 0;
          do {
            bVar7 = check_item(this,(LASitem *)((long)&this->items->type + lVar6));
            if (!bVar7) {
              return false;
            }
            uVar5 = uVar5 + 1;
            lVar6 = lVar6 + 8;
            bVar7 = this->num_items <= uVar5;
          } while (!bVar7);
          return bVar7;
        }
        __assert_fail("(bytes + num) == b",
                      "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/laszip.cpp"
                      ,0x7f,"bool LASzip::unpack(const U8 *, const I32)");
      }
      error = "zero items to unpack";
    }
    else {
      error = "wrong number bytes to unpack";
    }
  }
  return_error(this,error);
  return false;
}

Assistant:

bool LASzip::unpack(const U8* bytes, const I32 num)
{
  // check input
  if (num < 34) return return_error("too few bytes to unpack");
  if (((num - 34) % 6) != 0) return return_error("wrong number bytes to unpack"); 
  if (((num - 34) / 6) == 0) return return_error("zero items to unpack");
  num_items = (num - 34) / 6;

  // create item list
  if (items) delete [] items;
  items = new LASitem[num_items];

  // do the unpacking
  U16 i;
  const U8* b = bytes;
  compressor = *((const U16*)b);
  b += 2;
  coder = *((const U16*)b);
  b += 2;
  version_major = *((const U8*)b);
  b += 1;
  version_minor = *((const U8*)b);
  b += 1;
  version_revision = *((const U16*)b);
  b += 2;
  options = *((const U32*)b);
  b += 4;
  chunk_size = *((const U32*)b);
  b += 4;
  number_of_special_evlrs = *((const I64*)b);
  b += 8;
  offset_to_special_evlrs = *((const I64*)b);
  b += 8;
  num_items = *((const U16*)b);
  b += 2;
  for (i = 0; i < num_items; i++)
  {
    items[i].type = (LASitem::Type)*((const U16*)b);
    b += 2;
    items[i].size = *((const U16*)b);
    b += 2;
    items[i].version = *((const U16*)b);
    b += 2;
  }
  assert((bytes + num) == b);

  // check if we support the contents

  for (i = 0; i < num_items; i++)
  {
    if (!check_item(&items[i])) return false;
  }
  return true;
}